

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

int json_object_clear(json_t *json)

{
  if ((json != (json_t *)0x0) && (json->type == JSON_OBJECT)) {
    hashtable_clear((hashtable_t *)(json + 2));
    return 0;
  }
  return -1;
}

Assistant:

int json_object_clear(json_t *json) {
    json_object_t *object;

    if (!json_is_object(json))
        return -1;

    object = json_to_object(json);
    hashtable_clear(&object->hashtable);

    return 0;
}